

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> __thiscall
flatbuffers::FlatCompiler::GenerateCode
          (FlatCompiler *this,FlatCOptions *options,Parser *conform_parser)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *filepath;
  byte bVar1;
  byte bVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  long lVar5;
  long *plVar6;
  bool bVar7;
  _Head_base<0UL,_flatbuffers::Parser_*,_false> _Var8;
  size_type sVar9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  Parser *pPVar14;
  uint8_t *puVar15;
  long *plVar16;
  long *plVar17;
  Parser *in_RCX;
  size_type *psVar18;
  ulong *puVar19;
  long *plVar20;
  long lVar21;
  ulong uVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reuse_tracker;
  string filebase;
  string contents;
  string ext;
  IDLOptions opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  _Head_base<0UL,_flatbuffers::Parser_*,_false> local_518;
  _Base_ptr local_510;
  string local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  undefined1 local_4c8 [64];
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  long local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  int local_444;
  string local_440;
  uint8_t *local_420;
  long *local_418;
  long local_410;
  long local_408;
  long lStack_400;
  _Base_ptr *local_3f8;
  ulong local_3f0;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  Parser *local_388;
  string local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_360 [2];
  pointer local_350 [2];
  undefined1 local_340 [576];
  size_type local_100;
  unsigned_long local_a8;
  
  local_388 = in_RCX;
  pPVar14 = (Parser *)operator_new(0x780);
  Parser::Parser(pPVar14,(IDLOptions *)conform_parser);
  *(Parser **)&(this->code_generators_)._M_t._M_impl = pPVar14;
  local_510 = (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
  local_518._M_head_impl = (Parser *)this;
  if (local_510 !=
      (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    local_3f8 = &(conform_parser->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_parent;
    filepath = &(conform_parser->file_extension_).field_2;
    do {
      IDLOptions::IDLOptions((IDLOptions *)local_340,(IDLOptions *)conform_parser);
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      local_440._M_string_length = 0;
      local_440.field_2._M_local_buf[0] = '\0';
      bVar10 = LoadFile(*(char **)local_510,true,&local_440);
      if (!bVar10) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4c8,"unable to load file: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_510);
        (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                  (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c8,1,1);
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
        }
      }
      lVar21 = (long)local_510 -
               (long)(conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
      p_Var3 = (conform_parser->known_attributes_)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_right;
      GetExtension(&local_380,(string *)local_510);
      iVar13 = std::__cxx11::string::compare((char *)&local_380);
      if (iVar13 == 0) {
        bVar10 = true;
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)&local_380);
        bVar10 = iVar13 == 0;
      }
      if ((bVar10) && (local_100 == 0)) {
        StripFileName((string *)local_4c8,(string *)local_510);
        std::__cxx11::string::operator=((string *)(local_340 + 0x238),(string *)local_4c8);
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
        }
      }
      iVar13 = std::__cxx11::string::compare((char *)&local_380);
      sVar9 = local_440._M_string_length;
      local_444 = iVar13;
      if ((_Base_ptr)(lVar21 >> 5) < p_Var3) {
        if (((iVar13 != 0) && (local_340[1] == false)) &&
           (puVar15 = (uint8_t *)strlen(local_440._M_dataplus._M_p), (uint8_t *)sVar9 != puVar15)) {
          std::operator+((string *)local_4c8,"input file appears to be binary: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_510);
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,(string *)local_4c8,1,1);
          if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
            operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
          }
        }
        bVar7 = (bool)(iVar13 == 0 | bVar10);
        if (bVar7) {
          pPVar14 = (Parser *)operator_new(0x780);
          Parser::Parser(pPVar14,(IDLOptions *)local_340);
          std::__uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
          reset((__uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> *)
                local_518._M_head_impl,pPVar14);
        }
        _Var24._M_p = local_440._M_dataplus._M_p;
        _Var8._M_head_impl = local_518._M_head_impl;
        if (local_444 == 0) {
          LoadBinarySchema((FlatCompiler *)options,
                           (Parser *)((local_518._M_head_impl)->super_ParserState).prev_cursor_,
                           (string *)local_510,&local_440);
LAB_00303147:
          lVar21._0_1_ = (conform_parser->opts).gen_jvmstatic;
          lVar21._1_1_ = (conform_parser->opts).use_flexbuffers;
          lVar21._2_1_ = (conform_parser->opts).strict_json;
          lVar21._3_1_ = (conform_parser->opts).output_default_scalars_in_json;
          lVar21._4_4_ = (conform_parser->opts).indent_step;
          if ((bool)(bVar7 & lVar21 != 0)) {
LAB_0030315a:
            Parser::ConformTo_abi_cxx11_
                      ((string *)local_4c8,
                       (Parser *)((local_518._M_head_impl)->super_ParserState).prev_cursor_,
                       local_388);
            if (local_4c8._8_8_ != 0) {
              std::operator+(&local_538,"schemas don\'t conform: ",(string *)local_4c8);
              (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                        (options,&local_538,0,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) {
                operator_delete(local_538._M_dataplus._M_p,
                                local_538.field_2._M_allocated_capacity + 1);
              }
            }
            if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
              operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
            }
          }
        }
        else {
          if (local_340[1] == true) {
            if (local_a8 == 0x80) {
              local_538._M_dataplus._M_p = (pointer)0x0;
              local_538._M_string_length = 0;
              local_538.field_2._M_allocated_capacity = 0;
              local_420 = (uint8_t *)local_440._M_string_length;
              flexbuffers::Verifier::Verifier
                        ((Verifier *)local_4c8,(uint8_t *)local_440._M_dataplus._M_p,
                         local_440._M_string_length,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_538,true,
                         0x40);
              bVar11 = flexbuffers::Verifier::VerifyBuffer((Verifier *)local_4c8);
              if (!bVar11) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4c8,"flexbuffers file failed to verify: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_510);
                (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                          (options,(Verifier *)local_4c8,0,1);
                if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
                  operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
                }
              }
              puVar15 = local_420 + (long)_Var24._M_p;
              bVar1 = puVar15[-2];
              bVar2 = puVar15[-1];
              pcVar4 = ((local_518._M_head_impl)->super_ParserState).prev_cursor_;
              *(ulong *)(pcVar4 + 0x2e8) = (long)(puVar15 + -2) - (ulong)bVar2;
              *(ulong *)(pcVar4 + 0x2f0) =
                   (1L << (bVar1 & 3)) << 8 | (ulong)(bVar1 >> 2) << 0x20 | (ulong)bVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                uVar22 = local_538.field_2._M_allocated_capacity - (long)local_538._M_dataplus._M_p;
                _Var24._M_p = local_538._M_dataplus._M_p;
LAB_00303142:
                operator_delete(_Var24._M_p,uVar22);
              }
            }
            else {
              flexbuffers::Builder::Clear
                        ((Builder *)
                         (((local_518._M_head_impl)->super_ParserState).prev_cursor_ + 0x248));
              ParseFile((FlatCompiler *)options,
                        (Parser *)((_Var8._M_head_impl)->super_ParserState).prev_cursor_,
                        (string *)local_510,&local_440,
                        (vector<const_char_*,_std::allocator<const_char_*>_> *)local_3f8);
            }
            goto LAB_00303147;
          }
          ParseFile((FlatCompiler *)options,
                    (Parser *)((local_518._M_head_impl)->super_ParserState).prev_cursor_,
                    (string *)local_510,&local_440,
                    (vector<const_char_*,_std::allocator<const_char_*>_> *)local_3f8);
          if (!bVar10) {
            if (*(int *)(((local_518._M_head_impl)->super_ParserState).prev_cursor_ + 0x1f8) == 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4c8,"input file is neither json nor a .fbs (schema) file: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_510);
              (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                        (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4c8,1,1);
              if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
                uVar22 = local_4c8._16_8_ + 1;
                _Var24._M_p = (pointer)local_4c8._0_8_;
                goto LAB_00303142;
              }
            }
            goto LAB_00303147;
          }
          lVar5._0_1_ = (conform_parser->opts).gen_jvmstatic;
          lVar5._1_1_ = (conform_parser->opts).use_flexbuffers;
          lVar5._2_1_ = (conform_parser->opts).strict_json;
          lVar5._3_1_ = (conform_parser->opts).output_default_scalars_in_json;
          lVar5._4_4_ = (conform_parser->opts).indent_step;
          if (lVar5 != 0) goto LAB_0030315a;
        }
        if ((*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 4
                      ) != '\0') || (local_340[0xfb] == true)) {
          Parser::Serialize((Parser *)((local_518._M_head_impl)->super_ParserState).prev_cursor_);
        }
        if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 4)
            == '\x01') {
          pcVar4 = ((local_518._M_head_impl)->super_ParserState).prev_cursor_;
          std::__cxx11::string::_M_replace
                    ((ulong)(pcVar4 + 800),0,*(char **)(pcVar4 + 0x328),0x3677dc);
        }
      }
      else {
        FlatBufferBuilderImpl<false>::Clear
                  ((FlatBufferBuilderImpl<false> *)
                   (((local_518._M_head_impl)->super_ParserState).prev_cursor_ + 0x1c8));
        sVar9 = local_440._M_string_length;
        _Var24._M_p = local_440._M_dataplus._M_p;
        pcVar4 = ((local_518._M_head_impl)->super_ParserState).prev_cursor_;
        if ((uint8_t *)local_440._M_string_length != (uint8_t *)0x0) {
          vector_downward<unsigned_int>::ensure_space
                    ((vector_downward<unsigned_int> *)(pcVar4 + 0x1c8),local_440._M_string_length);
          lVar21 = *(long *)(pcVar4 + 0x208);
          *(void **)(pcVar4 + 0x208) = (void *)(lVar21 - sVar9);
          *(int *)(pcVar4 + 0x1f8) = *(int *)(pcVar4 + 0x1f8) + (int)sVar9;
          memcpy((void *)(lVar21 - sVar9),_Var24._M_p,sVar9);
        }
        pcVar4[0x229] = '\x01';
        if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 3)
            == '\0') {
          pcVar4 = ((local_518._M_head_impl)->super_ParserState).prev_cursor_;
          if (*(long *)(pcVar4 + 0x308) == 0) {
            std::operator+(&local_538,"current schema has no file_identifier: cannot test if \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_510);
            plVar16 = (long *)std::__cxx11::string::append((char *)&local_538);
            psVar18 = (size_type *)(plVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_4c8._16_8_ = *psVar18;
              local_4c8._24_4_ = (undefined4)plVar16[3];
              local_4c8._28_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
              local_4c8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_4c8 + 0x10);
            }
            else {
              local_4c8._16_8_ = *psVar18;
              local_4c8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar16;
            }
            local_4c8._8_8_ = plVar16[1];
            *plVar16 = (long)psVar18;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,local_4c8,1,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_4c8 + 0x10)) {
              operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
            }
            uVar23 = local_538.field_2._M_allocated_capacity;
            _Var24._M_p = local_538._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
LAB_0030340d:
              operator_delete(_Var24._M_p,uVar23 + 1);
            }
          }
          else {
            iVar13 = strncmp(local_440._M_dataplus._M_p + (ulong)local_340[0x161] * 4 + 4,
                             *(char **)(pcVar4 + 0x300),4);
            if (iVar13 != 0) {
              std::operator+(&local_4e8,"binary \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_510);
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_4e8);
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              psVar18 = (size_type *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_508.field_2._M_allocated_capacity = *psVar18;
                local_508.field_2._8_8_ = plVar16[3];
              }
              else {
                local_508.field_2._M_allocated_capacity = *psVar18;
                local_508._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_508._M_string_length = plVar16[1];
              *plVar16 = (long)psVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_508,
                                           *(ulong *)(((local_518._M_head_impl)->super_ParserState).
                                                      prev_cursor_ + 0x300));
              puVar19 = (ulong *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_538.field_2._M_allocated_capacity = *puVar19;
                local_538.field_2._8_8_ = plVar16[3];
                local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              }
              else {
                local_538.field_2._M_allocated_capacity = *puVar19;
                local_538._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_538._M_string_length = plVar16[1];
              *plVar16 = (long)puVar19;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_538);
              psVar18 = (size_type *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_4c8._16_8_ = *psVar18;
                local_4c8._24_4_ = (undefined4)plVar16[3];
                local_4c8._28_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
                local_4c8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_4c8 + 0x10);
              }
              else {
                local_4c8._16_8_ = *psVar18;
                local_4c8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar16;
              }
              local_4c8._8_8_ = plVar16[1];
              *plVar16 = (long)psVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                        (options,local_4c8,1,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_4c8 + 0x10)) {
                operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) {
                operator_delete(local_538._M_dataplus._M_p,
                                local_538.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              uVar23 = local_4e8.field_2._M_allocated_capacity;
              _Var24._M_p = local_4e8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) goto LAB_0030340d;
            }
          }
        }
      }
      StripExtension(&local_538,(string *)local_510);
      StripPath((string *)local_4c8,&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
      }
      _Var8._M_head_impl = local_518._M_head_impl;
      local_3f0 = 0;
      local_420 = (uint8_t *)0x0;
      if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 6)
          == '\x01') {
        Parser::Serialize((Parser *)((local_518._M_head_impl)->super_ParserState).prev_cursor_);
        local_420 = FlatBufferBuilderImpl<false>::GetBufferPointer
                              ((FlatBufferBuilderImpl<false> *)
                               (((_Var8._M_head_impl)->super_ParserState).prev_cursor_ + 0x1c8));
        local_3f0 = (ulong)*(uint *)(((_Var8._M_head_impl)->super_ParserState).prev_cursor_ + 0x1f8)
        ;
      }
      plVar6 = (long *)(conform_parser->opts).cpp_object_api_string_type.field_2.
                       _M_allocated_capacity;
      for (plVar16 = (long *)(conform_parser->opts).cpp_object_api_string_type._M_string_length;
          plVar16 != plVar6; plVar16 = plVar16 + 2) {
        if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 2)
            == '\x01') {
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          local_538._M_string_length = 0;
          local_538.field_2._M_allocated_capacity =
               local_538.field_2._M_allocated_capacity & 0xffffffffffffff00;
          iVar13 = (**(code **)(*(long *)*plVar16 + 0x28))
                             ((long *)*plVar16,
                              ((local_518._M_head_impl)->super_ParserState).prev_cursor_,filepath,
                              local_510,&local_538);
          if ((iVar13 == 0) && (local_538._M_string_length != 0)) {
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3c8,local_538._M_dataplus._M_p,
                       local_538._M_dataplus._M_p + local_538._M_string_length);
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8," ","");
            local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8," \\","");
            WordWrap(&local_508,&local_3c8,0x50,&local_3e8,&local_3a8);
            puts(local_508._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
              operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar23 = local_3c8.field_2._M_allocated_capacity;
            _Var24._M_p = local_3c8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
LAB_00303b1f:
              operator_delete(_Var24._M_p,(ulong)(uVar23 + 1));
            }
          }
          else {
            (**(code **)(*(long *)*plVar16 + 0x60))(&local_4e8);
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_4e8,0,(char *)0x0,0x3880b2);
            local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
            psVar18 = (size_type *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_508.field_2._M_allocated_capacity = *psVar18;
              local_508.field_2._8_8_ = plVar17[3];
            }
            else {
              local_508.field_2._M_allocated_capacity = *psVar18;
              local_508._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_508._M_string_length = plVar17[1];
            *plVar17 = (long)psVar18;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&local_508,1,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1
                             );
            }
            uVar23 = local_4e8.field_2._M_allocated_capacity;
            _Var24._M_p = local_4e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) goto LAB_00303b1f;
          }
LAB_00303b27:
          uVar23 = local_538.field_2._M_allocated_capacity;
          _Var24._M_p = local_538._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
LAB_00303b3b:
            operator_delete(_Var24._M_p,uVar23 + 1);
          }
        }
        else {
          EnsureDirExists((string *)filepath);
          cVar12 = (**(code **)(*(long *)*plVar16 + 0x48))();
          if (cVar12 != '\0') {
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            local_538._M_string_length = 0;
            local_538.field_2._M_allocated_capacity =
                 local_538.field_2._M_allocated_capacity & 0xffffffffffffff00;
            std::__cxx11::string::_M_assign((string *)&local_538);
            iVar13 = (**(code **)(*(long *)*plVar16 + 0x20))
                               ((long *)*plVar16,local_420,local_3f0,&local_538);
            if (iVar13 != 0) {
              (**(code **)(*(long *)*plVar16 + 0x60))(local_360);
              plVar17 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_360,0,(char *)0x0,0x3880d1);
              local_418 = &local_408;
              plVar20 = plVar17 + 2;
              if ((long *)*plVar17 == plVar20) {
                local_408 = *plVar20;
                lStack_400 = plVar17[3];
              }
              else {
                local_408 = *plVar20;
                local_418 = (long *)*plVar17;
              }
              local_410 = plVar17[1];
              *plVar17 = (long)plVar20;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_418);
              local_468 = &local_458;
              puVar19 = (ulong *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_458._M_allocated_capacity = *puVar19;
                local_458._8_8_ = plVar17[3];
              }
              else {
                local_458._M_allocated_capacity = *puVar19;
                local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar17;
              }
              local_460 = plVar17[1];
              *plVar17 = (long)puVar19;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_468,local_4c8._0_8_);
              local_488 = &local_478;
              plVar20 = plVar17 + 2;
              if ((long *)*plVar17 == plVar20) {
                local_478 = *plVar20;
                lStack_470 = plVar17[3];
              }
              else {
                local_478 = *plVar20;
                local_488 = (long *)*plVar17;
              }
              local_480 = plVar17[1];
              *plVar17 = (long)plVar20;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_488,*(ulong *)(*plVar16 + 8));
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              puVar19 = (ulong *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_4e8.field_2._M_allocated_capacity = *puVar19;
                local_4e8.field_2._8_8_ = plVar17[3];
              }
              else {
                local_4e8.field_2._M_allocated_capacity = *puVar19;
                local_4e8._M_dataplus._M_p = (pointer)*plVar17;
              }
              local_4e8._M_string_length = plVar17[1];
              *plVar17 = (long)puVar19;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_4e8);
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              psVar18 = (size_type *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_508.field_2._M_allocated_capacity = *psVar18;
                local_508.field_2._8_8_ = plVar17[3];
              }
              else {
                local_508.field_2._M_allocated_capacity = *psVar18;
                local_508._M_dataplus._M_p = (pointer)*plVar17;
              }
              local_508._M_string_length = plVar17[1];
              *plVar17 = (long)psVar18;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                        (options,&local_508,1,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                operator_delete(local_4e8._M_dataplus._M_p,
                                local_4e8.field_2._M_allocated_capacity + 1);
              }
              if (local_488 != &local_478) {
                operator_delete(local_488,local_478 + 1);
              }
              if (local_468 != &local_458) {
                operator_delete(local_468,local_458._M_allocated_capacity + 1);
              }
              if (local_418 != &local_408) {
                operator_delete(local_418,local_408 + 1);
              }
              uVar23 = local_350[0];
              _Var24._M_p = (pointer)local_360[0];
              if (local_360[0] !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350) goto LAB_00303b1f;
            }
            goto LAB_00303b27;
          }
          cVar12 = (**(code **)(*(long *)*plVar16 + 0x40))();
          if (((local_444 == 0) || (cVar12 != '\x01' || bVar10)) &&
             (iVar13 = (**(code **)(*(long *)*plVar16 + 0x10))
                                 ((long *)*plVar16,
                                  ((local_518._M_head_impl)->super_ParserState).prev_cursor_,
                                  filepath,local_4c8), iVar13 != 0)) {
            (**(code **)(*(long *)*plVar16 + 0x60))(&local_468);
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_468,0,(char *)0x0,0x3880d1);
            local_488 = &local_478;
            plVar20 = plVar17 + 2;
            if ((long *)*plVar17 == plVar20) {
              local_478 = *plVar20;
              lStack_470 = plVar17[3];
            }
            else {
              local_478 = *plVar20;
              local_488 = (long *)*plVar17;
            }
            local_480 = plVar17[1];
            *plVar17 = (long)plVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_488);
            local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
            puVar19 = (ulong *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_4e8.field_2._M_allocated_capacity = *puVar19;
              local_4e8.field_2._8_8_ = plVar17[3];
            }
            else {
              local_4e8.field_2._M_allocated_capacity = *puVar19;
              local_4e8._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_4e8._M_string_length = plVar17[1];
            *plVar17 = (long)puVar19;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_4e8,local_4c8._0_8_);
            local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
            psVar18 = (size_type *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_508.field_2._M_allocated_capacity = *psVar18;
              local_508.field_2._8_8_ = plVar17[3];
            }
            else {
              local_508.field_2._M_allocated_capacity = *psVar18;
              local_508._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_508._M_string_length = plVar17[1];
            *plVar17 = (long)psVar18;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            plVar17 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_508,*(ulong *)(*plVar16 + 8));
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            puVar19 = (ulong *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_538.field_2._M_allocated_capacity = *puVar19;
              local_538.field_2._8_8_ = plVar17[3];
            }
            else {
              local_538.field_2._M_allocated_capacity = *puVar19;
              local_538._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_538._M_string_length = plVar17[1];
            *plVar17 = (long)puVar19;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&local_538,1,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
              operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_488 != &local_478) {
              operator_delete(local_488,local_478 + 1);
            }
            uVar23 = local_458._M_allocated_capacity;
            _Var24._M_p = (pointer)local_468;
            if (local_468 != &local_458) goto LAB_00303b3b;
          }
        }
        if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 5)
            == '\x01') {
          iVar13 = (**(code **)(*(long *)*plVar16 + 0x30))
                             ((long *)*plVar16,
                              ((local_518._M_head_impl)->super_ParserState).prev_cursor_,filepath,
                              local_4c8);
          if (iVar13 == 1) {
            (**(code **)(*(long *)*plVar16 + 0x60))(&local_508);
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_508,0,(char *)0x0,0x38812a);
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            puVar19 = (ulong *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_538.field_2._M_allocated_capacity = *puVar19;
              local_538.field_2._8_8_ = plVar17[3];
            }
            else {
              local_538.field_2._M_allocated_capacity = *puVar19;
              local_538._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_538._M_string_length = plVar17[1];
            *plVar17 = (long)puVar19;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&local_538,1,1);
          }
          else {
            if (iVar13 != 3) goto LAB_00303cbe;
            (**(code **)(*(long *)*plVar16 + 0x60))(&local_508);
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_508,0,(char *)0x0,0x3880fc);
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            puVar19 = (ulong *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_538.field_2._M_allocated_capacity = *puVar19;
              local_538.field_2._8_8_ = plVar17[3];
            }
            else {
              local_538.field_2._M_allocated_capacity = *puVar19;
              local_538._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_538._M_string_length = plVar17[1];
            *plVar17 = (long)puVar19;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            (**(code **)((long)&(options->opts).cpp_object_api_pointer_type.field_2 + 8))
                      (options,&local_538,1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
        }
LAB_00303cbe:
      }
      if (local_340._368_8_ != 0) {
        bVar10 = Parser::SetRootType((Parser *)
                                     ((local_518._M_head_impl)->super_ParserState).prev_cursor_,
                                     (char *)local_340._360_8_);
        if (bVar10) {
          if (*(char *)(*(long *)(((local_518._M_head_impl)->super_ParserState).prev_cursor_ + 0x2f8
                                 ) + 0x110) != '\x01') goto LAB_00303f88;
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_538,"root type must be a table","");
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,&local_538,1,1);
        }
        else {
          std::operator+(&local_538,"unknown root type: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_340 + 0x168));
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,&local_538,1,1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
      }
LAB_00303f88:
      Parser::MarkGenerated((Parser *)((local_518._M_head_impl)->super_ParserState).prev_cursor_);
      if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
        operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p,
                        CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                                 local_440.field_2._M_local_buf[0]) + 1);
      }
      IDLOptions::~IDLOptions((IDLOptions *)local_340);
      local_510 = local_510 + 1;
    } while (local_510 !=
             (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    ;
  }
  return (__uniq_ptr_data<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>,_true,_true>
         )(tuple<flatbuffers::Parser_*,_std::default_delete<flatbuffers::Parser>_>)
          local_518._M_head_impl;
}

Assistant:

std::unique_ptr<Parser> FlatCompiler::GenerateCode(const FlatCOptions &options,
                                                   Parser &conform_parser) {
  std::unique_ptr<Parser> parser =
      std::unique_ptr<Parser>(new Parser(options.opts));

  for (auto file_it = options.filenames.begin();
       file_it != options.filenames.end(); ++file_it) {
    IDLOptions opts = options.opts;

    auto &filename = *file_it;
    std::string contents;
    if (!flatbuffers::LoadFile(filename.c_str(), true, &contents))
      Error("unable to load file: " + filename);

    bool is_binary = static_cast<size_t>(file_it - options.filenames.begin()) >=
                     options.binary_files_from;
    auto ext = flatbuffers::GetExtension(filename);
    const bool is_schema = ext == "fbs" || ext == "proto";
    if (is_schema && opts.project_root.empty()) {
      opts.project_root = StripFileName(filename);
    }
    const bool is_binary_schema = ext == reflection::SchemaExtension();
    if (is_binary) {
      parser->builder_.Clear();
      parser->builder_.PushFlatBuffer(
          reinterpret_cast<const uint8_t *>(contents.c_str()),
          contents.length());
      if (!options.raw_binary) {
        // Generally reading binaries that do not correspond to the schema
        // will crash, and sadly there's no way around that when the binary
        // does not contain a file identifier.
        // We'd expect that typically any binary used as a file would have
        // such an identifier, so by default we require them to match.
        if (!parser->file_identifier_.length()) {
          Error("current schema has no file_identifier: cannot test if \"" +
                filename +
                "\" matches the schema, use --raw-binary to read this file"
                " anyway.");
        } else if (!flatbuffers::BufferHasIdentifier(
                       contents.c_str(), parser->file_identifier_.c_str(),
                       opts.size_prefixed)) {
          Error("binary \"" + filename +
                "\" does not have expected file_identifier \"" +
                parser->file_identifier_ +
                "\", use --raw-binary to read this file anyway.");
        }
      }
    } else {
      // Check if file contains 0 bytes.
      if (!opts.use_flexbuffers && !is_binary_schema &&
          contents.length() != strlen(contents.c_str())) {
        Error("input file appears to be binary: " + filename, true);
      }
      if (is_schema || is_binary_schema) {
        // If we're processing multiple schemas, make sure to start each
        // one from scratch. If it depends on previous schemas it must do
        // so explicitly using an include.
        parser.reset(new Parser(opts));
      }
      // Try to parse the file contents (binary schema/flexbuffer/textual
      // schema)
      if (is_binary_schema) {
        LoadBinarySchema(*parser, filename, contents);
      } else if (opts.use_flexbuffers) {
        if (opts.lang_to_generate == IDLOptions::kJson) {
          auto data = reinterpret_cast<const uint8_t *>(contents.c_str());
          auto size = contents.size();
          std::vector<uint8_t> reuse_tracker;
          if (!flexbuffers::VerifyBuffer(data, size, &reuse_tracker))
            Error("flexbuffers file failed to verify: " + filename, false);
          parser->flex_root_ = flexbuffers::GetRoot(data, size);
        } else {
          parser->flex_builder_.Clear();
          ParseFile(*parser, filename, contents, options.include_directories);
        }
      } else {
        ParseFile(*parser, filename, contents, options.include_directories);
        if (!is_schema && !parser->builder_.GetSize()) {
          // If a file doesn't end in .fbs, it must be json/binary. Ensure we
          // didn't just parse a schema with a different extension.
          Error("input file is neither json nor a .fbs (schema) file: " +
                    filename,
                true);
        }
      }
      if ((is_schema || is_binary_schema) &&
          !options.conform_to_schema.empty()) {
        auto err = parser->ConformTo(conform_parser);
        if (!err.empty()) Error("schemas don\'t conform: " + err, false);
      }
      if (options.schema_binary || opts.binary_schema_gen_embed) {
        parser->Serialize();
      }
      if (options.schema_binary) {
        parser->file_extension_ = reflection::SchemaExtension();
      }
    }
    std::string filebase =
        flatbuffers::StripPath(flatbuffers::StripExtension(filename));

    // If one of the generators uses bfbs, serialize the parser and get
    // the serialized buffer and length.
    const uint8_t *bfbs_buffer = nullptr;
    int64_t bfbs_length = 0;
    if (options.requires_bfbs) {
      parser->Serialize();
      bfbs_buffer = parser->builder_.GetBufferPointer();
      bfbs_length = parser->builder_.GetSize();
    }

    for (const std::shared_ptr<CodeGenerator> &code_generator :
         options.generators) {
      if (options.print_make_rules) {
        std::string make_rule;
        const CodeGenerator::Status status = code_generator->GenerateMakeRule(
            *parser, options.output_path, filename, make_rule);
        if (status == CodeGenerator::Status::OK && !make_rule.empty()) {
          printf("%s\n",
                 flatbuffers::WordWrap(make_rule, 80, " ", " \\").c_str());
        } else {
          Error("Cannot generate make rule for " +
                code_generator->LanguageName());
        }
      } else {
        flatbuffers::EnsureDirExists(options.output_path);

        // Prefer bfbs generators if present.
        if (code_generator->SupportsBfbsGeneration()) {
          CodeGenOptions code_gen_options;
          code_gen_options.output_path = options.output_path;

          const CodeGenerator::Status status = code_generator->GenerateCode(
              bfbs_buffer, bfbs_length, code_gen_options);
          if (status != CodeGenerator::Status::OK) {
            Error("Unable to generate " + code_generator->LanguageName() +
                  " for " + filebase + code_generator->status_detail +
                  " using bfbs generator.");
          }
        } else {
          if ((!code_generator->IsSchemaOnly() ||
               (is_schema || is_binary_schema)) &&
              code_generator->GenerateCode(*parser, options.output_path,
                                           filebase) !=
                  CodeGenerator::Status::OK) {
            Error("Unable to generate " + code_generator->LanguageName() +
                  " for " + filebase + code_generator->status_detail);
          }
        }
      }

      if (options.grpc_enabled) {
        const CodeGenerator::Status status = code_generator->GenerateGrpcCode(
            *parser, options.output_path, filebase);

        if (status == CodeGenerator::Status::NOT_IMPLEMENTED) {
          Warn("GRPC interface generator not implemented for " +
               code_generator->LanguageName());
        } else if (status == CodeGenerator::Status::ERROR) {
          Error("Unable to generate GRPC interface for " +
                code_generator->LanguageName());
        }
      }
    }

    if (!opts.root_type.empty()) {
      if (!parser->SetRootType(opts.root_type.c_str()))
        Error("unknown root type: " + opts.root_type);
      else if (parser->root_struct_def_->fixed)
        Error("root type must be a table");
    }

    // We do not want to generate code for the definitions in this file
    // in any files coming up next.
    parser->MarkGenerated();
  }

  return parser;
}